

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.cc
# Opt level: O0

int OBJ_find_sigid_by_algs(int *psignid,int dig_nid,int pkey_nid)

{
  ulong local_28;
  size_t i;
  int pkey_nid_local;
  int digest_nid_local;
  int *out_sign_nid_local;
  
  local_28 = 0;
  while( true ) {
    if (0x11 < local_28) {
      return 0;
    }
    if ((kTriples[local_28].digest_nid == dig_nid) && (kTriples[local_28].pkey_nid == pkey_nid))
    break;
    local_28 = local_28 + 1;
  }
  if (psignid != (int *)0x0) {
    *psignid = kTriples[local_28].sign_nid;
  }
  return 1;
}

Assistant:

int OBJ_find_sigid_by_algs(int *out_sign_nid, int digest_nid, int pkey_nid) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTriples); i++) {
    if (kTriples[i].digest_nid == digest_nid &&
        kTriples[i].pkey_nid == pkey_nid) {
      if (out_sign_nid != NULL) {
        *out_sign_nid = kTriples[i].sign_nid;
      }
      return 1;
    }
  }

  return 0;
}